

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool convertToEnum(QMetaType fromType,void *from,QMetaType toType,void *to)

{
  bool bVar1;
  int iVar2;
  unsigned_long_long *puVar3;
  qsizetype qVar4;
  unsigned_long_long *in_RCX;
  QMetaType in_RDX;
  unsigned_long_long *in_RSI;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar5;
  QMetaType in_stack_00000028;
  char *in_stack_00000038;
  bool ok;
  int fromTypeId;
  QByteArray keys;
  QMetaEnum en;
  qlonglong value;
  optional<unsigned_long_long> v;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QByteArray *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Storage<unsigned_long_long,_true> in_stack_ffffffffffffff58;
  bool local_85;
  byte local_69;
  unsigned_long_long local_30;
  QMetaType in_stack_fffffffffffffff0;
  undefined1 *puVar6;
  QMetaType fromType_00;
  
  fromType_00.d_ptr = *(QMetaTypeInterface **)(in_FS_OFFSET + 0x28);
  iVar2 = QMetaType::id((QMetaType *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  local_30 = 0xffffffffffffffff;
  local_85 = false;
  if ((iVar2 == 10) || (iVar2 == 0xc)) {
    metaEnumFromType(in_stack_00000028);
    bVar1 = QMetaEnum::isValid((QMetaEnum *)0x388e80);
    if (bVar1) {
      if (iVar2 == 10) {
        QString::toUtf8((QString *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      else {
        QByteArray::QByteArray
                  (in_stack_ffffffffffffff30,
                   (QByteArray *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      puVar6 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::constData((QByteArray *)0x388ef3);
      oVar5 = QMetaEnum::keysToValue64((QMetaEnum *)in_RDX.d_ptr,in_stack_00000038);
      in_stack_ffffffffffffff58._M_value =
           oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long>._M_payload;
      in_stack_ffffffffffffff57 =
           oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long>._M_engaged;
      in_stack_fffffffffffffff0.d_ptr =
           (QMetaTypeInterface *)CONCAT71((int7)((ulong)puVar6 >> 8),in_stack_ffffffffffffff57);
      local_85 = std::optional::operator_cast_to_bool((optional<unsigned_long_long> *)0x388f33);
      if (local_85) {
        puVar3 = std::optional<unsigned_long_long>::operator*
                           ((optional<unsigned_long_long> *)0x388f4b);
        local_30 = *puVar3;
      }
      QByteArray::~QByteArray((QByteArray *)0x388f83);
    }
  }
  if (local_85 == false) {
    if (iVar2 == 4) {
      local_30 = *in_RSI;
      local_85 = true;
    }
    else {
      QMetaType::fromType<long_long>();
      local_85 = QMetaType::convert(fromType_00,(void *)in_stack_ffffffffffffff58,
                                    in_stack_fffffffffffffff0,
                                    (void *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50));
    }
  }
  if (local_85 == false) {
    local_69 = 0;
  }
  else {
    qVar4 = QMetaType::sizeOf((QMetaType *)&stack0xffffffffffffffd8);
    switch(qVar4) {
    case 1:
      *(char *)in_RCX = (char)local_30;
      local_69 = 1;
      break;
    case 2:
      *(short *)in_RCX = (short)local_30;
      local_69 = 1;
      break;
    default:
      break;
    case 4:
      *(int *)in_RCX = (int)local_30;
      local_69 = 1;
      break;
    case 8:
      *in_RCX = local_30;
      local_69 = 1;
    }
  }
  if (*(QMetaTypeInterface **)(in_FS_OFFSET + 0x28) == fromType_00.d_ptr) {
    return (bool)(local_69 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool convertToEnum(QMetaType fromType, const void *from, QMetaType toType, void *to)
{
    int fromTypeId = fromType.id();
    qlonglong value = -1;
    bool ok = false;
#ifndef QT_NO_QOBJECT
    if (fromTypeId == QMetaType::QString || fromTypeId == QMetaType::QByteArray) {
        QMetaEnum en = metaEnumFromType(toType);
        if (en.isValid()) {
            QByteArray keys = (fromTypeId == QMetaType::QString)
                    ? static_cast<const QString *>(from)->toUtf8()
                    : *static_cast<const QByteArray *>(from);
            if (auto v = en.keysToValue64(keys.constData())) {
                ok = true;
                value = *v;
            }
        }
    }
#endif
    if (!ok) {
        if (fromTypeId == QMetaType::LongLong) {
            value = *static_cast<const qlonglong *>(from);
            ok = true;
        } else {
            ok = QMetaType::convert(fromType, from, QMetaType::fromType<qlonglong>(), &value);
        }
    }

    if (!ok)
        return false;

    switch (toType.sizeOf()) {
    case 1:
        *static_cast<signed char *>(to) = value;
        return true;
    case 2:
        *static_cast<qint16 *>(to) = value;
        return true;
    case 4:
        *static_cast<qint32 *>(to) = value;
        return true;
    case 8:
        *static_cast<qint64 *>(to) = value;
        return true;
    default:
        Q_UNREACHABLE_RETURN(false);
    }
}